

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::TryExpr::TryExpr(TryExpr *this,Location *loc)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined ***)this = &PTR__Expr_001a44c8;
  pcVar1 = (loc->filename)._M_str;
  sVar2 = (loc->field_1).field_1.offset;
  uVar3 = *(undefined8 *)((long)&loc->field_1 + 8);
  *(size_t *)&this->field_0x18 = (loc->filename)._M_len;
  *(char **)&this->field_0x20 = pcVar1;
  *(size_t *)&this->field_0x28 = sVar2;
  *(undefined8 *)&this->field_0x30 = uVar3;
  *(undefined8 *)&this->field_0x38 = 0x3d;
  *(undefined ***)this = &PTR__TryExpr_001a5670;
  (this->block).label._M_dataplus._M_p = (pointer)&(this->block).label.field_2;
  (this->block).label._M_string_length = 0;
  (this->block).label.field_2._M_local_buf[0] = '\0';
  (this->block).decl.has_func_type = false;
  Var::Var(&(this->block).decl.type_var);
  (this->block).end_loc.filename._M_str = (char *)0x0;
  (this->block).end_loc.field_1.field_1.offset = 0;
  (this->block).exprs.size_ = 0;
  (this->block).end_loc.filename._M_len = 0;
  (this->block).exprs.first_ = (Expr *)0x0;
  (this->block).exprs.last_ = (Expr *)0x0;
  *(pointer *)
   ((long)&(this->block).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->block).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->block).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->block).decl.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block).decl.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->block).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->block).end_loc.field_1.field_0.last_column = 0;
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->catches).super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Var::Var(&this->delegate_target);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc), kind(TryKind::Plain) {}